

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

entity * e_at(int x,int y)

{
  entity *local_20;
  int local_14;
  int entitycnt;
  int y_local;
  int x_local;
  
  local_14 = 0;
  while ((local_14 < 2 &&
         (((occupants[local_14].edata == (permonst *)0x0 || (occupants[local_14].ex != x)) ||
          (occupants[local_14].ey != y))))) {
    local_14 = local_14 + 1;
  }
  if (local_14 == 2) {
    local_20 = (entity *)0x0;
  }
  else {
    local_20 = occupants + local_14;
  }
  return local_20;
}

Assistant:

static struct entity *e_at(int x, int y)
{
	int entitycnt;

	for (entitycnt = 0; entitycnt < ENTITIES; entitycnt++)
		if ((occupants[entitycnt].edata) &&
		    (occupants[entitycnt].ex == x) &&
		    (occupants[entitycnt].ey == y))
			break;
	return((entitycnt == ENTITIES)?
	       NULL : &(occupants[entitycnt]));
}